

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall
Assimp::MDLImporter::CopyMaterials_3DGS_MDL7(MDLImporter *this,IntSharedData_MDL7 *shared)

{
  aiMaterial **ppaVar1;
  aiScene *paVar2;
  ulong uVar3;
  
  this->pScene->mNumMaterials =
       (uint)((ulong)((long)(shared->pcMats).
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(shared->pcMats).
                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3);
  paVar2 = this->pScene;
  ppaVar1 = (aiMaterial **)operator_new__((ulong)paVar2->mNumMaterials << 3);
  paVar2->mMaterials = ppaVar1;
  paVar2 = this->pScene;
  if (paVar2->mNumMaterials != 0) {
    uVar3 = 0;
    do {
      paVar2->mMaterials[uVar3] =
           (shared->pcMats).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3];
      uVar3 = uVar3 + 1;
      paVar2 = this->pScene;
    } while (uVar3 < paVar2->mNumMaterials);
  }
  return;
}

Assistant:

void MDLImporter::CopyMaterials_3DGS_MDL7(MDL::IntSharedData_MDL7 &shared)
{
    pScene->mNumMaterials = (unsigned int)shared.pcMats.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
        pScene->mMaterials[i] = shared.pcMats[i];
}